

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linked_definitions_section.cpp
# Opt level: O2

void __thiscall
LinkedDefinitionsSection_RoundTripForPopulated_Test::TestBody
          (LinkedDefinitionsSection_RoundTripForPopulated_Test *this)

{
  digest d;
  digest d_00;
  element_type *this_00;
  pointer begin;
  undefined4 uVar1;
  database_reference this_01;
  string *psVar2;
  parser<pstore::exchange::import_ns::callbacks> *this_02;
  value_reference_type ppVar3;
  linked_definitions *plVar4;
  uint uVar5;
  database *pdVar6;
  database **this_03;
  _func_int **pp_Var7;
  char *expected_predicate_value;
  initializer_list<pstore::repo::linked_definitions::value_type> __l;
  extent<pstore::repo::fragment> x;
  extent<pstore::repo::fragment> x_00;
  initializer_list<pstore::repo::definition> __l_00;
  undefined4 in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_418;
  mock_mutex mutex;
  undefined3 uStack_40f;
  undefined4 uStack_40c;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  extent<pstore::repo::fragment> fext;
  undefined8 in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  mock_mutex mutex_2;
  shared_ptr<const_pstore::repo::fragment> imported_fragment;
  AssertHelper local_3b0;
  digest imported_digest;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragments_index;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  __uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
  local_270 [2];
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  exported_content;
  string exported_json;
  const_iterator pos;
  coord local_130;
  pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
  local_128;
  
  pos.visited_parents_.c_._M_elems[2].position = 1;
  pos.visited_parents_.c_._M_elems[3].node = (index_pointer)0xffffffffffffffff;
  pos.visited_parents_.c_._M_elems[1].position = 0x9abcdef0;
  pos.visited_parents_.c_._M_elems[2].node.internal_ = (internal_node *)0x12345678;
  pos.visited_parents_.c_._M_elems._8_16_ = ZEXT816(0xffffffffffffffff) << 0x40;
  pos.db_ = (database_reference)0x9abcdef0;
  pos.visited_parents_.c_._M_elems[0].node.internal_ = (internal_node *)0x12345678;
  __l._M_len = 2;
  __l._M_array = (iterator)&pos;
  std::
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  ::vector(&exported_content,__l,(allocator_type *)&transaction);
  begin = exported_content.
          super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
          ._M_impl.super__Vector_impl_data._M_start;
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&pos,&mutex);
  pdVar6 = &(this->super_LinkedDefinitionsSection).export_db_;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,pdVar6,(lock_type *)&pos);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&pos);
  imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  imported_fragment.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (database_reference)operator_new(0x20);
  pstore::repo::linked_definitions_creation_dispatcher::linked_definitions_creation_dispatcher
            ((linked_definitions_creation_dispatcher *)this_01,begin,
             exported_content.
             super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pos.db_ = this_01;
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
  ::emplace_back<pstore::repo::linked_definitions_creation_dispatcher*>
            ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
              *)&imported_fragment,(linked_definitions_creation_dispatcher **)&pos);
  fext = pstore::repo::fragment::
         alloc<pstore::transaction<std::unique_lock<mock_mutex>>,pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
                   (&transaction,
                    (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                     )imported_fragment.
                      super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                              )imported_fragment.
                               super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)&fragments_index,pdVar6);
  pstore::exchange::export_ns::ostringstream::ostringstream((ostringstream *)&pos);
  pstore::database::getro<pstore::repo::fragment,void>
            ((database *)&imported_digest,(extent<pstore::repo::fragment> *)pdVar6);
  pstore::exchange::export_ns::emit_fragment
            ((ostream_base *)&pos,(indent)0x0,pdVar6,(string_mapping *)&fragments_index,
             (shared_ptr<const_pstore::repo::fragment> *)&imported_digest,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&imported_digest.v_ + 8));
  psVar2 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)&pos);
  std::__cxx11::string::string((string *)&exported_json,(string *)psVar2);
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)&pos);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&fragments_index);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
             *)&imported_fragment);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&pos,(mutex_type *)&fext);
  pdVar6 = &(this->super_LinkedDefinitionsSection).import_db_;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,pdVar6,(lock_type *)&pos);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&pos);
  d.v_._4_4_ = in_stack_fffffffffffffbdc;
  d.v_._0_4_ = 4;
  d.v_._8_4_ = 0;
  d.v_._12_4_ = in_stack_fffffffffffffbe4;
  x.size = 0x9abcdef0;
  x.addr.a_.a_ = (address)0x12345678;
  pstore::repo::definition::definition
            ((definition *)&pos,d,x,(typed_address<pstore::indirect_string>)0x0,internal_no_symbol,
             default_vis);
  expected_predicate_value = (char *)0x0;
  d_00.v_._4_4_ = in_stack_fffffffffffffbdc;
  d_00.v_._0_4_ = 4;
  d_00.v_._8_4_ = 0;
  d_00.v_._12_4_ = in_stack_fffffffffffffbe4;
  x_00.size = 0x9abcdef0;
  x_00.addr.a_.a_ = (address)0x12345678;
  pstore::repo::definition::definition
            ((definition *)&pos.visited_parents_.c_._M_elems[2].position,d_00,x_00,
             (typed_address<pstore::indirect_string>)0x0,internal_no_symbol,default_vis);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&pos;
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::vector
            ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
             &fragments_index,__l_00,(allocator_type *)&imported_fragment);
  pstore::index::
  get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&imported_fragment,transaction.super_transaction_base.db_,true);
  this_00 = imported_fragment.
            super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pos.visited_parents_.c_._M_elems._8_16_ =
       pstore::repo::compilation::
       alloc<pstore::transaction<std::unique_lock<mock_mutex>>,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                 (&transaction,(typed_address<pstore::indirect_string>)0x0,
                  (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                   )fragments_index.
                    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,
                  (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                   )fragments_index.
                    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
  pos.db_ = (database_reference)0x9abcdef0;
  pos.visited_parents_.c_._M_elems[0].node.internal_ = (internal_node *)0x12345678;
  pstore::index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::insert<pstore::uint128,pstore::extent<pstore::repo::compilation>,void>
            (&local_128,
             (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
              *)this_00,&transaction.super_transaction_base,
             (pair<pstore::uint128,_pstore::extent<pstore::repo::compilation>_> *)&pos);
  std::
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
  ::~unique_ptr(&local_128.first.pos_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&imported_fragment.
              super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::
  ~_Vector_base((_Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *
                )&fragments_index);
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  imported_digest.v_._0_8_ = 0x9abcdef0;
  imported_digest.v_._8_8_ = 0x31415192;
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&pos,&mutex_2);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&fragments_index,pdVar6,(lock_type *)&pos
            );
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&pos);
  transaction.super_transaction_base.dbsize_ = (uint64_t)&transaction.super_transaction_base.dbsize_
  ;
  transaction.super_transaction_base._vptr_transaction_base = (_func_int **)0x0;
  transaction.super_transaction_base.db_ = (database *)0x0;
  transaction.super_transaction_base.size_ = 0;
  transaction.lock_._M_device = (mutex_type *)0x0;
  transaction.lock_._8_8_ = &transaction.lock_._M_owns;
  fext.addr.a_.a_ = (address)(address)pdVar6;
  transaction.super_transaction_base.first_.a_ = transaction.super_transaction_base.dbsize_;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant((not_null<pstore::database_*> *)&fext)
  ;
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>
            ((not_null<pstore::database_*>)in_stack_fffffffffffffc18,
             (transaction<std::unique_lock<mock_mutex>_> *)in_stack_fffffffffffffc10,
             (string_mapping *)fext.size,(uint128 *)fext.addr.a_.a_);
  pstore::json::make_parser<pstore::exchange::import_ns::callbacks>
            ((parser<pstore::exchange::import_ns::callbacks> *)&pos,(callbacks *)&imported_fragment,
             none);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&imported_fragment.
              super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  this_02 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      ((parser<pstore::exchange::import_ns::callbacks> *)&pos,&exported_json);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_02);
  uVar1 = pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_;
  local_408._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  _mutex = CONCAT31(uStack_40f,pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0);
  if (pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_408);
    pstore::exchange::import_ns::context::apply_patches
              ((context *)pos.visited_parents_.c_._M_elems[6].node.internal_,
               (transaction_base *)&fragments_index);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&pos);
    pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)&transaction);
    pstore::transaction_base::commit((transaction_base *)&fragments_index);
  }
  else {
    testing::Message::Message((Message *)&local_418);
    std::operator<<((ostream *)(local_418._M_head_impl + 0x10),"JSON error was: ");
    (**(code **)(*(long *)pos.visited_parents_.c_._M_elems[5].position + 0x20))
              (&imported_fragment,pos.visited_parents_.c_._M_elems[5].position,
               pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_);
    std::operator<<((ostream *)(local_418._M_head_impl + 0x10),(string *)&imported_fragment);
    std::operator<<((ostream *)(local_418._M_head_impl + 0x10),' ');
    local_130.column = (undefined4)pos.visited_parents_.c_._M_elems[9].position;
    local_130.row = pos.visited_parents_.c_._M_elems[9].position._4_4_;
    pstore::json::operator<<((ostream *)(local_418._M_head_impl + 0x10),&local_130);
    std::operator<<((ostream *)(local_418._M_head_impl + 0x10),'\n');
    std::operator<<((ostream *)(local_418._M_head_impl + 0x10),(string *)&exported_json);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&fext,(internal *)&mutex,(AssertionResult *)0x1b88f8,"true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
               ,0xaf,(char *)fext.addr.a_.a_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    std::__cxx11::string::~string((string *)&fext);
    std::__cxx11::string::~string((string *)&imported_fragment);
    if (local_418._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_418._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_408);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&pos);
    pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)&transaction);
  }
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&fragments_index);
  if (uVar1 != 0) goto LAB_0016471f;
  pstore::index::
  get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&fragments_index,pdVar6,true);
  pstore::index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::find<pstore::uint128,void>
            (&pos,(hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                   *)fragments_index.
                     super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,pdVar6,&imported_digest);
  memset(&transaction.super_transaction_base.db_,0,0xd8);
  local_270[0]._M_t.
  super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_false>
  ._M_head_impl =
       (tuple<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
        )(_Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
          )0x0;
  transaction.super_transaction_base._vptr_transaction_base = (_func_int **)pdVar6;
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<false>>
            ((internal *)&imported_fragment,"pos","fragments_index->end (import_db_)",&pos,
             (iterator_base<false> *)&transaction);
  std::
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
  ::~unique_ptr((unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
                 *)local_270);
  if ((char)imported_fragment.
            super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&transaction);
    if (imported_fragment.
        super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var7 = (_func_int **)0x1c5bef;
    }
    else {
      pp_Var7 = (imported_fragment.
                 super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fext,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
               ,0xbd,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fext,(Message *)&transaction);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fext);
    if (transaction.super_transaction_base._vptr_transaction_base != (_func_int **)0x0) {
      (**(code **)(*transaction.super_transaction_base._vptr_transaction_base + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&imported_fragment.
                      super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&imported_fragment.
                      super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
    ppVar3 = pstore::index::
             hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
             ::iterator_base<true>::operator*(&pos);
    pstore::repo::fragment::load((fragment *)&imported_fragment,pdVar6,&ppVar3->second);
    uVar5 = ((imported_fragment.
              super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            arr_).sa_.bitmap_ & 0x40000;
    this_03 = (database **)&fext.size;
    fext.addr.a_.a_._1_7_ = fext.addr.a_.a_._1_7_;
    fext.addr.a_.a_._0_1_ = (char)(uVar5 >> 0x12);
    fext.size = 0;
    if (uVar5 == 0) {
      testing::Message::Message((Message *)&mutex);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&transaction,(internal *)&fext,
                 (AssertionResult *)
                 "imported_fragment->has_section (repo::section_kind::linked_definitions)","false",
                 "true",expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_418,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                 ,0xbf,(char *)transaction.super_transaction_base._vptr_transaction_base);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_418,(Message *)&mutex);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_418);
      std::__cxx11::string::~string((string *)&transaction);
      if ((long *)CONCAT44(uStack_40c,_mutex) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(uStack_40c,_mutex) + 8))();
      }
LAB_0016449f:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_03);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_03);
      plVar4 = pstore::repo::fragment::
               at_impl<(pstore::repo::section_kind)18,pstore::repo::fragment_const&,pstore::repo::linked_definitions_const>
                         (imported_fragment.
                          super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
      fext.addr.a_.a_ = (address)(address)plVar4->size_;
      _mutex = 2;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&transaction,"linked.size ()","2U",(unsigned_long *)&fext,
                 (uint *)&mutex);
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&fext);
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var7 = (_func_int **)0x1c5bef;
        }
        else {
          pp_Var7 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mutex,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                   ,0xc2,(char *)pp_Var7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&fext);
        this_03 = &transaction.super_transaction_base.db_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
        if (fext.addr.a_.a_ != 0) {
          (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
        }
        goto LAB_0016449f;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
                ((internal *)&transaction,"expos->compilation","impos->compilation",
                 &(exported_content.
                   super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                   ._M_impl.super__Vector_impl_data._M_start)->compilation,
                 &plVar4->definitions_[0].compilation);
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&fext);
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var7 = (_func_int **)0x1c5bef;
        }
        else {
          pp_Var7 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mutex,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                   ,0xc5,(char *)pp_Var7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&fext);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
        if (fext.addr.a_.a_ != 0) {
          (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&transaction,"expos->index","impos->index",
                 &(exported_content.
                   super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                   ._M_impl.super__Vector_impl_data._M_start)->index,&plVar4->definitions_[0].index)
      ;
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&fext);
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var7 = (_func_int **)0x1c5bef;
        }
        else {
          pp_Var7 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mutex,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                   ,0xc6,(char *)pp_Var7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&fext);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
        if (fext.addr.a_.a_ != 0) {
          (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      anon_unknown.dwarf_294b29::check_linked_definition(pdVar6,plVar4->definitions_);
      testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
                ((internal *)&transaction,"expos->compilation","impos->compilation",
                 &exported_content.
                  super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].compilation,(uint128 *)(plVar4 + 1));
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&fext);
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var7 = (_func_int **)0x1c5bef;
        }
        else {
          pp_Var7 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mutex,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                   ,0xca,(char *)pp_Var7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&fext);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
        if (fext.addr.a_.a_ != 0) {
          (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&transaction,"expos->index","impos->index",
                 &exported_content.
                  super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].index,(uint *)plVar4[1].definitions_)
      ;
      if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
        testing::Message::Message((Message *)&fext);
        if (transaction.super_transaction_base.db_ == (database *)0x0) {
          pp_Var7 = (_func_int **)0x1c5bef;
        }
        else {
          pp_Var7 = (transaction.super_transaction_base.db_)->_vptr_database;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mutex,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                   ,0xcb,(char *)pp_Var7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&fext);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
        if (fext.addr.a_.a_ != 0) {
          (**(code **)(*(long *)fext.addr.a_.a_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&transaction.super_transaction_base.db_);
      anon_unknown.dwarf_294b29::check_linked_definition(pdVar6,(value_type *)(plVar4 + 1));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&imported_fragment.
                super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
  ::~unique_ptr(&pos.pos_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fragments_index.
              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
LAB_0016471f:
  std::__cxx11::string::~string((string *)&exported_json);
  std::
  _Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  ::~_Vector_base(&exported_content.
                   super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                 );
  return;
}

Assistant:

TEST_F (LinkedDefinitionsSection, RoundTripForPopulated) {
    using testing::ContainerEq;
    constexpr auto referenced_compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    constexpr auto max_addr =
        typed_address<repo::definition>::make (std::numeric_limits<std::uint64_t>::max ());
    std::vector<repo::linked_definitions::value_type> exported_content{
        {referenced_compilation_digest, UINT32_C (0), max_addr},
        {referenced_compilation_digest, UINT32_C (1), max_addr},
    };

    // Build and export a fragment which contains a linked-definitions section with the contents
    // supplied from the export_content vector. The resulting JSON is in exported_json.
    std::string exported_json = this->export_fragment (
        exported_content.data (), exported_content.data () + exported_content.size ());

    // Now build the import database. First we we create a compilation that the linked-definition
    // fragment will later reference.
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            constexpr index::digest fragment_digest{0x9ABCDEF0, 0x12345678};
            pstore::extent<repo::fragment> const fext;
            constexpr auto str = pstore::typed_address<pstore::indirect_string>::make (0U);
            std::vector<repo::definition> definitions{
                {fragment_digest, fext, str, pstore::repo::linkage::external},
                {fragment_digest, fext, str, pstore::repo::linkage::external},
            };
            auto compilation_index =
                pstore::index::get_index<pstore::trailer::indices::compilation> (transaction.db ());
            compilation_index->insert (
                transaction, std::make_pair (referenced_compilation_digest,
                                             repo::compilation::alloc (transaction, str /*triple*/,
                                                                       std::begin (definitions),
                                                                       std::end (definitions))));
        }
        transaction.commit ();
    }

    constexpr auto imported_digest = pstore::index::digest{0x31415192, 0x9ABCDEF0};
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            exchange::import_ns::string_mapping imported_names;
            auto parser = make_json_object_parser<exchange::import_ns::fragment_sections> (
                &import_db_, &transaction, &imported_names, &imported_digest);
            parser.input (exported_json).eof ();
            ASSERT_FALSE (parser.has_error ())
                << "JSON error was: " << parser.last_error ().message () << ' '
                << parser.coordinate () << '\n'
                << exported_json;

            std::shared_ptr<exchange::import_ns::context> const & ctxt =
                parser.callbacks ().get_context ();
            ctxt->apply_patches (&transaction);
        }
        transaction.commit ();
    }

    auto fragments_index = index::get_index<trailer::indices::fragment> (import_db_);
    auto pos = fragments_index->find (import_db_, imported_digest);
    ASSERT_NE (pos, fragments_index->end (import_db_));
    auto imported_fragment = repo::fragment::load (import_db_, pos->second);
    ASSERT_TRUE (imported_fragment->has_section (repo::section_kind::linked_definitions));
    repo::linked_definitions const & linked =
        imported_fragment->at<repo::section_kind::linked_definitions> ();
    ASSERT_EQ (linked.size (), 2U);
    auto expos = exported_content.begin ();
    auto impos = linked.begin ();
    EXPECT_EQ (expos->compilation, impos->compilation);
    EXPECT_EQ (expos->index, impos->index);
    check_linked_definition (import_db_, *impos);
    ++expos;
    ++impos;
    EXPECT_EQ (expos->compilation, impos->compilation);
    EXPECT_EQ (expos->index, impos->index);
    check_linked_definition (import_db_, *impos);
}